

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

int helicsInputGetVectorSize(HelicsInput inp)

{
  HelicsInput pvVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = 0;
  pvVar1 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar1 = inp;
  }
  if (pvVar1 != (HelicsInput)0x0) {
    sVar2 = helics::Input::getVectorSize(*(Input **)((long)pvVar1 + 0x18));
    iVar3 = (int)sVar2;
  }
  return iVar3;
}

Assistant:

int helicsInputGetVectorSize(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return 0;
    }
    try {
        return static_cast<int>(inpObj->inputPtr->getVectorSize());
    }
    // LCOV_EXCL_START
    catch (...) {
        return 0;
    }
    // LCOV_EXCL_STOP
}